

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void wr_dungeon(void)

{
  wr_u16b(player->depth);
  wr_u16b(daycount);
  wr_u16b((uint16_t)(player->grid).y);
  wr_u16b((uint16_t)(player->grid).x);
  wr_byte('\x03');
  if (player->is_dead != false) {
    return;
  }
  wr_dungeon_aux((chunk *)cave);
  wr_dungeon_aux((chunk *)player->cave);
  compact_monsters((chunk *)cave,L'\0');
  return;
}

Assistant:

void wr_dungeon(void)
{
	/* Dungeon specific info follows */
	wr_u16b(player->depth);
	wr_u16b(daycount);
	wr_u16b(player->grid.y);
	wr_u16b(player->grid.x);
	wr_byte(SQUARE_SIZE);

	if (player->is_dead)
		return;

	/* Write caves */
	wr_dungeon_aux(cave);
	wr_dungeon_aux(player->cave);

	/* Compact the monsters */
	compact_monsters(cave, 0);
}